

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

void Fra_SmlInitializeGiven(Fra_Sml_t *p,Vec_Str_t *vSimInfo)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  uint *p_00;
  int nPatsPadded;
  int nPats;
  int k;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj;
  Vec_Str_t *vSimInfo_local;
  Fra_Sml_t *p_local;
  
  iVar2 = Vec_StrSize(vSimInfo);
  iVar3 = Aig_ManCiNum(p->pAig);
  iVar2 = iVar2 / iVar3;
  iVar3 = p->nWordsTotal << 5;
  iVar4 = Aig_ManRegNum(p->pAig);
  if (iVar4 != 0) {
    __assert_fail("Aig_ManRegNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39b,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  iVar4 = Vec_StrSize(vSimInfo);
  iVar5 = Aig_ManCiNum(p->pAig);
  if (iVar4 % iVar5 == 0) {
    if (iVar2 <= iVar3) {
      for (nPats = 0; iVar4 = Vec_PtrSize(p->pAig->vCis), nPats < iVar4; nPats = nPats + 1) {
        pvVar6 = Vec_PtrEntry(p->pAig->vCis,nPats);
        p_00 = Fra_ObjSim(p,*(int *)((long)pvVar6 + 0x24));
        for (nPatsPadded = 0; nPatsPadded < p->nWordsTotal; nPatsPadded = nPatsPadded + 1) {
          p_00[nPatsPadded] = 0;
        }
        for (nPatsPadded = 0; nPatsPadded < iVar2; nPatsPadded = nPatsPadded + 1) {
          iVar4 = Aig_ManCiNum(p->pAig);
          cVar1 = Vec_StrEntry(vSimInfo,nPatsPadded * iVar4 + nPats);
          if (cVar1 != '\0') {
            Abc_InfoSetBit(p_00,nPatsPadded);
          }
        }
        for (; nPatsPadded < iVar3; nPatsPadded = nPatsPadded + 1) {
          iVar4 = Aig_ManCiNum(p->pAig);
          cVar1 = Vec_StrEntry(vSimInfo,(iVar2 + -1) * iVar4 + nPats);
          if (cVar1 != '\0') {
            Abc_InfoSetBit(p_00,nPatsPadded);
          }
        }
      }
      return;
    }
    __assert_fail("nPats <= nPatsPadded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39d,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  __assert_fail("Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                ,0x39c,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
}

Assistant:

void Fra_SmlInitializeGiven( Fra_Sml_t * p, Vec_Str_t * vSimInfo )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k, nPats = Vec_StrSize(vSimInfo) / Aig_ManCiNum(p->pAig);
    int nPatsPadded = p->nWordsTotal * 32;
    assert( Aig_ManRegNum(p->pAig) == 0 );
    assert( Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0 );
    assert( nPats <= nPatsPadded );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        // clean data
        for ( k = 0; k < p->nWordsTotal; k++ )
            pSims[k] = 0;
        // load patterns
        for ( k = 0; k < nPats; k++ )
            if ( Vec_StrEntry(vSimInfo, k * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
        // pad the remaining bits with the value of the last pattern
        for ( ; k < nPatsPadded; k++ )
            if ( Vec_StrEntry(vSimInfo, (nPats-1) * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
    }
}